

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  Curl_easy *data;
  long lVar1;
  undefined8 uVar2;
  Curl_addrinfo *pCVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  int iVar8;
  _Bool _Var9;
  uint uVar10;
  CURLcode CVar11;
  timediff_t tVar12;
  int *piVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  curltime cVar17;
  curltime older;
  curltime newer;
  curltime newer_00;
  int error;
  int local_120;
  CURLcode local_11c;
  curltime local_118;
  _Bool *local_108;
  long local_100;
  ulong local_f8;
  ulong local_f0;
  char ipaddress [46];
  char buffer [128];
  
  data = conn->data;
  error = 0;
  *connected = false;
  if ((conn->bits).tcpconnect[sockindex] == true) {
    *connected = true;
  }
  else {
    cVar17 = Curl_now();
    local_118.tv_sec = cVar17.tv_sec;
    local_118.tv_usec = cVar17.tv_usec;
    local_f8 = Curl_timeleft(data,&local_118,true);
    if ((long)local_f8 < 0) {
      Curl_failf(data,"Connection time-out");
      return CURLE_OPERATION_TIMEDOUT;
    }
    local_11c = CURLE_OK;
    local_120 = sockindex;
    local_108 = connected;
    local_100 = (long)sockindex;
    for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
      if (conn->tempsock[lVar16] != -1) {
        uVar10 = Curl_socket_check(-1,-1,conn->tempsock[lVar16],0);
        uVar15 = (ulong)((uint)lVar16 ^ 1);
        if (uVar10 == 2) {
LAB_003f1182:
          _Var9 = verifyconnect(conn->tempsock[lVar16],&error);
          lVar1 = local_100;
          if (_Var9) {
            conn->sock[local_100] = conn->tempsock[lVar16];
            pCVar3 = conn->tempaddr[lVar16];
            conn->ip_addr = pCVar3;
            conn->tempsock[lVar16] = -1;
            *(uint *)&(conn->bits).field_0x4 =
                 *(uint *)&(conn->bits).field_0x4 & 0xfffffbff |
                 (uint)(pCVar3->ai_family == 10) << 10;
            if (conn->tempsock[uVar15] != -1) {
              Curl_closesocket(conn,conn->tempsock[uVar15]);
              conn->tempsock[uVar15] = -1;
            }
            iVar8 = local_120;
            CVar11 = Curl_connected_proxy(conn,local_120);
            if (CVar11 == CURLE_OK) {
              (conn->bits).tcpconnect[lVar1] = true;
              *local_108 = true;
              if (iVar8 == 0) {
                Curl_pgrsTime(data,TIMER_CONNECT);
              }
              Curl_updateconninfo(conn,conn->sock[lVar1]);
              Curl_verboseconnect(conn);
              return CURLE_OK;
            }
            return CVar11;
          }
          Curl_infof(data,"Connection failed\n");
        }
        else if (uVar10 == 0) {
          error = 0;
          newer.tv_usec = local_118.tv_usec;
          newer.tv_sec = local_118.tv_sec;
          uVar4 = (conn->connecttime).tv_sec;
          uVar5 = (conn->connecttime).tv_usec;
          cVar17.tv_usec = uVar5;
          cVar17.tv_sec = uVar4;
          cVar17._12_4_ = 0;
          newer._12_4_ = 0;
          tVar12 = Curl_timediff(newer,cVar17);
          if (conn->timeoutms_per_addr <= tVar12) {
            Curl_infof(data,"After %ldms connect time, move on!\n");
            error = 0x6e;
          }
          if (((lVar16 == 0) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
             (newer_00.tv_usec = local_118.tv_usec, newer_00.tv_sec = local_118.tv_sec,
             uVar6 = (conn->connecttime).tv_sec, uVar7 = (conn->connecttime).tv_usec,
             older.tv_usec = uVar7, older.tv_sec = uVar6, older._12_4_ = 0, newer_00._12_4_ = 0,
             tVar12 = Curl_timediff(newer_00,older), (data->set).happy_eyeballs_timeout <= tVar12))
          {
            trynextip(conn,local_120,1);
          }
        }
        else {
          if (((conn->bits).field_0x7 & 8) != 0) goto LAB_003f1182;
          if ((uVar10 & 4) != 0) {
            verifyconnect(conn->tempsock[lVar16],&error);
          }
        }
        iVar8 = error;
        if (error != 0) {
          (data->state).os_errno = error;
          piVar13 = __errno_location();
          *piVar13 = iVar8;
          if (conn->tempaddr[lVar16] != (Curl_addrinfo *)0x0) {
            local_f0 = uVar15;
            Curl_printable_address(conn->tempaddr[lVar16],ipaddress,0x2e);
            lVar1 = conn->port;
            pcVar14 = Curl_strerror(error,buffer,0x80);
            Curl_infof(data,"connect to %s port %ld failed: %s\n",ipaddress,lVar1,pcVar14);
            conn->timeoutms_per_addr =
                 local_f8 >> (conn->tempaddr[lVar16]->ai_next != (Curl_addrinfo *)0x0);
            CVar11 = trynextip(conn,local_120,(uint)lVar16);
            if ((CVar11 != CURLE_COULDNT_CONNECT) || (conn->tempsock[local_f0] == -1)) {
              local_11c = CVar11;
            }
          }
        }
      }
    }
    if ((local_11c != CURLE_OK) &&
       ((CVar11 = local_11c, conn->tempaddr[1] != (Curl_addrinfo *)0x0 ||
        (CVar11 = trynextip(conn,local_120,1), CVar11 != CURLE_OK)))) {
      uVar10 = *(uint *)&(conn->bits).field_0x4;
      lVar16 = 0x120;
      if (((uVar10 & 0x40) == 0) &&
         ((lVar16 = 0x160, (uVar10 & 0x20) == 0 && (lVar16 = 0x100, (uVar10 & 4) == 0)))) {
        lVar16 = 0xd0;
      }
      uVar2 = *(undefined8 *)((conn->chunk).hexbuffer + lVar16 + -0x20);
      lVar16 = conn->port;
      pcVar14 = Curl_strerror(error,buffer,0x80);
      Curl_failf(data,"Failed to connect to %s port %ld: %s",uVar2,lVar16,pcVar14);
      return CVar11;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = SOCKET_WRITABLE(conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      error = 0;
      if(Curl_timediff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        result = Curl_connected_proxy(conn, sockindex);
        if(result)
          return result;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
        char ipaddress[MAX_IPADR_LEN];
        char buffer[STRERROR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if(status != CURLE_COULDNT_CONNECT
            || conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */
    const char *hostname;
    char buffer[STRERROR_LEN];

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
          hostname, conn->port,
          Curl_strerror(error, buffer, sizeof(buffer)));
  }

  return result;
}